

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void btSoftBody::PSolve_Anchors(btSoftBody *psb,btScalar kst,btScalar ti)

{
  long *plVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btRigidBody *this;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  btVector3 bVar25;
  btVector3 local_40;
  
  lVar14 = (long)(psb->m_anchors).m_size;
  if (0 < lVar14) {
    fVar16 = kst * (psb->m_cfg).kAHR;
    fVar2 = (psb->m_sst).sdt;
    lVar15 = 0;
    do {
      plVar1 = (long *)((long)(((psb->m_anchors).m_data)->m_local).m_floats + lVar15 + -8);
      this = (btRigidBody *)plVar1[3];
      lVar12 = *plVar1;
      fVar19 = *(float *)(plVar1 + 1);
      fVar21 = *(float *)((long)plVar1 + 0xc);
      fVar22 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
      fVar24 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
      fVar3 = *(float *)(plVar1 + 2);
      fVar4 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
      fVar5 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
      fVar6 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
      fVar7 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
      fVar20 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
      fVar8 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
      fVar17 = (this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
      fVar9 = (this->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
      fVar10 = (this->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
      fVar18 = (this->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      bVar25 = btRigidBody::getVelocityInLocalPoint(this,(btVector3 *)((long)plVar1 + 0x54));
      fVar11 = *(float *)(lVar12 + 0x18);
      fVar23 = ((fVar3 * fVar17 + fVar19 * fVar8 + fVar21 * fVar20 + fVar18) - fVar11) * fVar16 +
               (bVar25.m_floats[2] * fVar2 - (fVar11 - *(float *)(lVar12 + 0x28)));
      fVar20 = *(float *)(plVar1 + 4);
      fVar8 = *(float *)((long)plVar1 + 100);
      fVar17 = (float)*(undefined8 *)(lVar12 + 0x10);
      fVar18 = (float)((ulong)*(undefined8 *)(lVar12 + 0x10) >> 0x20);
      fVar22 = ((fVar4 * fVar3 + fVar24 * fVar19 + fVar22 * fVar21 + fVar9) - fVar17) * fVar16 +
               (fVar2 * bVar25.m_floats[0] - (fVar17 - *(float *)(lVar12 + 0x20)));
      fVar21 = ((fVar7 * fVar3 + fVar6 * fVar19 + fVar5 * fVar21 + fVar10) - fVar18) * fVar16 +
               (bVar25.m_floats[1] * fVar2 - (fVar18 - *(float *)(lVar12 + 0x24)));
      fVar24 = (fVar23 * *(float *)((long)plVar1 + 0x4c) +
               fVar22 * *(float *)((long)plVar1 + 0x44) + fVar21 * *(float *)(plVar1 + 9)) * fVar20;
      fVar19 = fVar20 * (fVar23 * *(float *)((long)plVar1 + 0x2c) +
                        fVar22 * *(float *)((long)plVar1 + 0x24) + *(float *)(plVar1 + 5) * fVar21);
      fVar20 = fVar20 * (fVar23 * *(float *)((long)plVar1 + 0x3c) +
                        fVar22 * *(float *)((long)plVar1 + 0x34) + *(float *)(plVar1 + 7) * fVar21);
      *(ulong *)(lVar12 + 0x10) = CONCAT44(fVar8 * fVar20 + fVar18,fVar8 * fVar19 + fVar17);
      *(float *)(lVar12 + 0x18) = fVar8 * fVar24 + fVar11;
      uVar13 = CONCAT44(fVar20,fVar19) ^ 0x8000000080000000;
      local_40.m_floats[2] = -fVar24;
      local_40.m_floats[0] = (btScalar)(int)uVar13;
      local_40.m_floats[1] = (btScalar)(int)(uVar13 >> 0x20);
      local_40.m_floats[3] = 0.0;
      btRigidBody::applyImpulse
                ((btRigidBody *)plVar1[3],&local_40,(btVector3 *)((long)plVar1 + 0x54));
      lVar15 = lVar15 + 0x68;
    } while (lVar14 * 0x68 - lVar15 != 0);
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_Anchors(btSoftBody* psb,btScalar kst,btScalar ti)
{
	const btScalar	kAHR=psb->m_cfg.kAHR*kst;
	const btScalar	dt=psb->m_sst.sdt;
	for(int i=0,ni=psb->m_anchors.size();i<ni;++i)
	{
		const Anchor&		a=psb->m_anchors[i];
		const btTransform&	t=a.m_body->getWorldTransform();
		Node&				n=*a.m_node;
		const btVector3		wa=t*a.m_local;
		const btVector3		va=a.m_body->getVelocityInLocalPoint(a.m_c1)*dt;
		const btVector3		vb=n.m_x-n.m_q;
		const btVector3		vr=(va-vb)+(wa-n.m_x)*kAHR;
		const btVector3		impulse=a.m_c0*vr*a.m_influence;
		n.m_x+=impulse*a.m_c2;
		a.m_body->applyImpulse(-impulse,a.m_c1);
	}
}